

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

Real __thiscall NavierStokesBase::estTimeStep(NavierStokesBase *this)

{
  uint uVar1;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  FArrayBox *pFVar2;
  undefined8 uVar3;
  NavierStokesBase *pNVar4;
  ostream *poVar5;
  ulong uVar6;
  Print *pPVar7;
  int iVar8;
  int *piVar9;
  int idim;
  ulong uVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  long lVar22;
  double *pdVar23;
  bool bVar24;
  Real RVar25;
  double dVar26;
  double dVar27;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  double local_508;
  Box local_4fc;
  NavierStokesBase *local_4e0;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_4d8;
  long local_4d0;
  long local_4c8;
  long local_4c0;
  long local_4b8;
  pointer local_4b0;
  pointer local_4a8;
  long local_4a0;
  double *local_498;
  double *local_490;
  long local_488;
  long local_480;
  Arena *local_478;
  pointer local_470;
  ulong local_468;
  long local_460;
  long local_458;
  long local_450;
  Vector<double,_std::allocator<double>_> f_max;
  Vector<double,_std::allocator<double>_> u_max;
  MFIter mfi;
  Array4<double> local_3b8;
  Array4<double> local_378;
  undefined1 local_338 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_328;
  int local_310;
  MultiFab tforces;
  
  if (fixed_dt <= 0.0) {
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start)->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    std::vector<double,_std::allocator<double>_>::vector
              (&u_max.super_vector<double,_std::allocator<double>_>,3,(allocator_type *)local_338);
    std::vector<double,_std::allocator<double>_>::vector
              (&f_max.super_vector<double,_std::allocator<double>_>,3,(allocator_type *)local_338);
    local_4d8._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_AmrLevel).state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[2].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
          0x100000000;
    mfi.fabArray._0_4_ = 2;
    __l._M_len = 3;
    __l._M_array = (iterator)&mfi;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&tforces,__l,(allocator_type *)&local_3b8);
    amrex::MultiFab::norm0
              ((Vector<double,_std::allocator<double>_> *)local_338,
               (MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               (Vector<int,_std::allocator<int>_> *)&tforces,0,true,true);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&u_max.super_vector<double,_std::allocator<double>_>,
               (_Vector_base<double,_std::allocator<double>_> *)local_338);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_338);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&tforces);
    local_338._0_8_ = (pointer)0x1;
    local_338._8_8_ = (Arena *)0x0;
    vStack_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              (&tforces,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,3,0,
               (MFInfo *)local_338,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_328);
    amrex::MFIter::MFIter
              (&mfi,(FabArrayBase *)
                    this_00.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    local_4e0 = this;
    while (pNVar4 = local_4e0, mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::tilebox(&local_4fc,&mfi);
      RVar25 = amrex::StateData::curTime
                         ((pNVar4->super_AmrLevel).state.
                          super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      piVar9 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar9 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      pFVar2 = tforces.super_FabArray<amrex::FArrayBox>.m_fabs_v.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[*piVar9];
      if (getForceVerbose != 0) {
        poVar5 = amrex::OutStream();
        amrex::Print::Print((Print *)local_338,poVar5);
        std::operator<<((ostream *)&vStack_328,"---");
        std::operator<<((ostream *)&vStack_328,'\n');
        std::operator<<((ostream *)&vStack_328,"H - est Time Step:");
        std::operator<<((ostream *)&vStack_328,'\n');
        std::operator<<((ostream *)&vStack_328,"Calling getForce...");
        std::operator<<((ostream *)&vStack_328,'\n');
        amrex::Print::~Print((Print *)local_338);
      }
      piVar9 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar9 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      uVar3 = *(undefined8 *)
               (*(long *)&(((vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *)
                           ((long)this_00.
                                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                  .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl +
                           0x108))->
                          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                          )._M_impl + (long)*piVar9 * 8);
      (*(pNVar4->super_AmrLevel)._vptr_AmrLevel[0x2a])
                (RVar25,pNVar4,pFVar2,&local_4fc,0,3,uVar3,uVar3,3,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_338,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_3b8,
                 (FabArray<amrex::FArrayBox> *)
                 local_4d8._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_378,&tforces.super_FabArray<amrex::FArrayBox>,&mfi);
      local_4a8 = (pointer)local_338._0_8_;
      local_478 = (Arena *)local_338._8_8_;
      local_4b0 = vStack_328.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_4c8 = (long)local_4fc.smallend.vect[1];
      lVar19 = (long)local_4fc.smallend.vect[2];
      local_460 = local_378.jstride * 8;
      local_4c0 = local_378.kstride * 8;
      lVar12 = (long)local_4fc.smallend.vect[0];
      local_458 = CONCAT44(local_3b8.jstride._4_4_,(undefined4)local_3b8.jstride) * 8;
      local_4b8 = local_3b8.kstride * 8;
      local_480 = (long)vStack_328.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      local_4d0 = (long)local_310;
      local_468 = (ulong)(uint)local_4fc.bigend.vect[0];
      local_450 = (long)local_4fc.bigend.vect[1];
      local_4a0 = (long)local_4fc.bigend.vect[2];
      pdVar15 = (double *)
                ((lVar19 - local_378.begin.z) * local_4c0 +
                 (local_4c8 - local_378.begin.y) * local_460 + lVar12 * 8 +
                 (long)local_378.begin.x * -8 + (long)local_378.p);
      pdVar17 = (double *)
                ((lVar19 - local_3b8.begin.z) * local_4b8 +
                 (local_4c8 - local_3b8.begin.y) * local_458 + lVar12 * 8 +
                 (long)local_3b8.begin.x * -8 + (long)local_3b8.p);
      while (lVar20 = lVar19, pdVar16 = pdVar17, pdVar14 = pdVar15, lVar20 <= local_4a0) {
        local_470 = (pointer)(local_338._0_8_ +
                             (lVar20 - local_4d0) *
                             (long)vStack_328.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start * 8);
        pdVar15 = pdVar14;
        pdVar17 = pdVar16;
        for (lVar19 = local_4c8; lVar19 <= local_450; lVar19 = lVar19 + 1) {
          if (local_4fc.smallend.vect[0] <= local_4fc.bigend.vect[0]) {
            pdVar11 = pdVar17;
            pdVar13 = pdVar15;
            lVar22 = lVar12;
            do {
              dVar26 = local_470[(lVar19 - local_480) * local_338._8_8_ +
                                 (lVar22 - (int)vStack_328.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)]
              ;
              lVar18 = 3;
              pdVar21 = pdVar11;
              pdVar23 = pdVar13;
              while (bVar24 = lVar18 != 0, lVar18 = lVar18 + -1, bVar24) {
                *pdVar23 = (*pdVar23 - *pdVar21) * (1.0 / dVar26);
                pdVar23 = pdVar23 + local_378.nstride;
                pdVar21 = pdVar21 + local_3b8.nstride;
              }
              lVar22 = lVar22 + 1;
              pdVar13 = pdVar13 + 1;
              pdVar11 = pdVar11 + 1;
            } while (local_4fc.bigend.vect[0] + 1U != (int)lVar22);
          }
          pdVar15 = pdVar15 + local_378.jstride;
          pdVar17 = pdVar17 + CONCAT44(local_3b8.jstride._4_4_,(undefined4)local_3b8.jstride);
        }
        pdVar15 = pdVar14 + local_378.kstride;
        pdVar17 = pdVar16 + local_3b8.kstride;
        local_498 = pdVar16;
        local_490 = pdVar14;
        local_488 = lVar20;
        lVar19 = lVar20 + 1;
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    local_3b8.p = (double *)0x100000000;
    local_3b8.jstride._0_4_ = 2;
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)&local_3b8;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&mfi,__l_00,(allocator_type *)&local_378);
    iVar8 = 1;
    amrex::MultiFab::norm0
              ((Vector<double,_std::allocator<double>_> *)local_338,&tforces,
               (Vector<int,_std::allocator<int>_> *)&mfi,0,true,true);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&f_max.super_vector<double,_std::allocator<double>_>,
               (_Vector_base<double,_std::allocator<double>_> *)local_338);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_338);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&mfi);
    dVar26 = 1e+20;
    for (lVar19 = 0; dVar27 = 1.0, lVar19 != 3; lVar19 = lVar19 + 1) {
      local_508 = dVar26;
      if ((1e-08 < u_max.super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar19]) &&
         (local_508 = (pNVar4->super_AmrLevel).geom.super_CoordSys.dx[lVar19] /
                      u_max.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar19], dVar26 <= local_508)) {
        local_508 = dVar26;
      }
      dVar26 = local_508;
      if (1e-08 < f_max.super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar19]) {
        dVar26 = (pNVar4->super_AmrLevel).geom.super_CoordSys.dx[lVar19];
        dVar26 = (dVar26 + dVar26) /
                 f_max.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar19];
        if (dVar26 < 0.0) {
          dVar26 = sqrt(dVar26);
        }
        else {
          dVar26 = SQRT(dVar26);
        }
        if (local_508 <= dVar26) {
          dVar26 = local_508;
        }
      }
    }
    if (1e+20 <= dVar26) {
      if (init_dt <= 0.0) {
        poVar5 = amrex::OutStream();
        amrex::Print::Print((Print *)local_338,poVar5);
        std::operator<<((ostream *)&vStack_328,
                        "\nNavierStokesBase::estTimeStep() failed to provide a good timestep ");
        std::operator<<((ostream *)&vStack_328,
                        "(probably because initial velocity field is zero with no external forcing).\n"
                       );
        std::operator<<((ostream *)&vStack_328,
                        "Use ns.init_dt to provide a reasonable timestep on coarsest level.\n");
        std::operator<<((ostream *)&vStack_328,
                        "Note that ns.init_shrink will be applied to init_dt.");
        std::endl<char,std::char_traits<char>>((ostream *)&vStack_328);
        amrex::Print::~Print((Print *)local_338);
        amrex::Abort_host("\n");
      }
      else {
        uVar1 = (pNVar4->super_AmrLevel).level;
        if (uVar1 != 0) {
          uVar10 = 0;
          uVar6 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar6 = uVar10;
          }
          for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
            iVar8 = iVar8 * (((pNVar4->super_AmrLevel).parent)->n_cycle).
                            super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar10 + 1];
          }
          dVar27 = 1.0 / (double)iVar8;
        }
        dVar26 = init_dt * dVar27;
      }
    }
    else {
      dVar26 = dVar26 * cfl;
    }
    if (verbose != 0) {
      poVar5 = amrex::OutStream();
      amrex::Print::Print((Print *)local_338,poVar5);
      std::operator<<((ostream *)&vStack_328,"estTimeStep :: \n");
      std::operator<<((ostream *)&vStack_328,"LEV = ");
      pPVar7 = amrex::Print::operator<<((Print *)local_338,&(pNVar4->super_AmrLevel).level);
      std::operator<<((ostream *)&pPVar7->ss," UMAX = ");
      amrex::Print::~Print((Print *)local_338);
      for (lVar19 = 0; lVar19 != 0x18; lVar19 = lVar19 + 8) {
        poVar5 = amrex::OutStream();
        amrex::Print::Print((Print *)local_338,poVar5);
        pPVar7 = amrex::Print::operator<<
                           ((Print *)local_338,
                            (double *)
                            ((long)u_max.super_vector<double,_std::allocator<double>_>.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar19));
        std::operator<<((ostream *)&pPVar7->ss,"  ");
        amrex::Print::~Print((Print *)local_338);
      }
      poVar5 = amrex::OutStream();
      amrex::Print::Print((Print *)local_338,poVar5);
      std::operator<<((ostream *)&vStack_328,'\n');
      amrex::Print::~Print((Print *)local_338);
      if (getForceVerbose != 0) {
        poVar5 = amrex::OutStream();
        amrex::Print::Print((Print *)local_338,poVar5);
        std::operator<<((ostream *)&vStack_328,"        FMAX = ");
        amrex::Print::~Print((Print *)local_338);
        for (lVar19 = 0; lVar19 != 0x18; lVar19 = lVar19 + 8) {
          poVar5 = amrex::OutStream();
          amrex::Print::Print((Print *)local_338,poVar5);
          pPVar7 = amrex::Print::operator<<
                             ((Print *)local_338,
                              (double *)
                              ((long)f_max.super_vector<double,_std::allocator<double>_>.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar19));
          std::operator<<((ostream *)&pPVar7->ss,"  ");
          amrex::Print::~Print((Print *)local_338);
        }
        poVar5 = amrex::OutStream();
        amrex::Print::Print((Print *)local_338,poVar5);
        std::operator<<((ostream *)&vStack_328,'\n');
        amrex::Print::~Print((Print *)local_338);
      }
      poVar5 = amrex::OutStream();
      amrex::Print::Print((Print *)local_338,poVar5);
      std::operator<<((ostream *)&vStack_328,"estimated timestep: dt = ");
      std::ostream::_M_insert<double>(dVar26);
      std::endl<char,std::char_traits<char>>((ostream *)&vStack_328);
      amrex::Print::~Print((Print *)local_338);
    }
    amrex::MultiFab::~MultiFab(&tforces);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&f_max);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&u_max);
  }
  else {
    uVar1 = (this->super_AmrLevel).level;
    if (uVar1 == 0) {
      dVar26 = 1.0;
    }
    else {
      iVar8 = 1;
      uVar10 = 0;
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar6 = uVar10;
      }
      for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        iVar8 = iVar8 * (((this->super_AmrLevel).parent)->n_cycle).
                        super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar10 + 1];
      }
      dVar26 = 1.0 / (double)iVar8;
    }
    dVar26 = fixed_dt * dVar26;
  }
  return dVar26;
}

Assistant:

Real
NavierStokesBase::estTimeStep ()
{
    BL_PROFILE("NavierStokesBase::estTimeStep()");

    if (fixed_dt > 0.0)
    {
        Real factor = 1.0;

        if (!(level == 0))
        {
            int ratio = 1;
            for (int lev = 1; lev <= level; lev++)
            {
                ratio *= parent->nCycle(lev);
            }
            factor = 1.0/Real(ratio);
        }

        return factor*fixed_dt;
    }

    const Real  small         = 1.0e-8;
    Real        estdt         = 1.0e+20;

    MultiFab&   S_new         = get_new_data(State_Type);

    Vector<Real> u_max(AMREX_SPACEDIM);
    Vector<Real> f_max(AMREX_SPACEDIM);

    MultiFab& Gp = get_new_data(Gradp_Type);

    //
    // Find local max of velocity
    //
    u_max = S_new.norm0({AMREX_D_DECL(0,1,2)},0,true,true);

    //
    // Compute forcing terms: in this case this means external forces and grad(p)
    // Viscous terms not included since Crack-Nicholson is unconditionally stable
    // so no need to account for explicit part of viscous term
    //
    MultiFab tforces(grids,dmap,AMREX_SPACEDIM,0,MFInfo(),Factory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const auto& bx          = mfi.tilebox();
       const auto  cur_time    = state[State_Type].curTime();
       auto& tforces_fab       = tforces[mfi];

       if (getForceVerbose) {
           amrex::Print() << "---" << '\n'
                          << "H - est Time Step:" << '\n'
                          << "Calling getForce..." << '\n';
       }
       getForce(tforces_fab,bx,0,AMREX_SPACEDIM,cur_time,S_new[mfi],S_new[mfi],Density,mfi);

       const auto& rho   = S_new.array(mfi,Density);
       const auto& gradp = Gp.array(mfi);
       const auto& force = tforces.array(mfi);
       amrex::ParallelFor(bx, [rho, gradp, force]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
          Real rho_inv = 1.0/rho(i,j,k);
          for (int n = 0; n < AMREX_SPACEDIM; n++) {
             force(i,j,k,n) -= gradp(i,j,k,n);
             force(i,j,k,n) *= rho_inv;
          }
       });
    }

    //
    // Find local max of tforces
    //
    f_max = tforces.norm0({AMREX_D_DECL(0,1,2)},0,true,true);

    //
    // Compute local estdt
    //
    const Real* dx = geom.CellSize();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        if (u_max[idim] > small)
        {
            estdt = std::min(estdt, dx[idim]/u_max[idim]);
        }

        if (f_max[idim] > small)
        {
            estdt = std::min(estdt, std::sqrt(2.0*dx[idim]/f_max[idim]));
        }
    }

    //
    // Reduce estimated dt by CFL factor and find global min
    //
    ParallelDescriptor::ReduceRealMin(estdt);

    if ( estdt < 1.0e+20) {
      //
      // timestep estimation successful
      //
      estdt = estdt * cfl;
    }
    else if (init_dt > 0 ) {
      //
      // use init_dt, scale for amr level
      //
      Real factor = 1.0;

      if (!(level == 0))
      {
         int ratio = 1;
         for (int lev = 1; lev <= level; lev++)
         {
           ratio *= parent->nCycle(lev);
         }
         factor = 1.0/Real(ratio);
      }

      estdt = factor*init_dt;
    } else {
      Print()<<"\nNavierStokesBase::estTimeStep() failed to provide a good timestep "
             <<"(probably because initial velocity field is zero with no external forcing).\n"
             <<"Use ns.init_dt to provide a reasonable timestep on coarsest level.\n"
             <<"Note that ns.init_shrink will be applied to init_dt."<<std::endl;
      amrex::Abort("\n");
    }

    if (verbose)
    {
        const int IOProc = ParallelDescriptor::IOProcessorNumber();
        ParallelDescriptor::ReduceRealMax(u_max.dataPtr(), AMREX_SPACEDIM, IOProc);

        amrex::Print() << "estTimeStep :: \n" << "LEV = " << level << " UMAX = ";
        for (int k = 0; k < AMREX_SPACEDIM; k++)
        {
            amrex::Print() << u_max[k] << "  ";
        }
        amrex::Print() << '\n';

        if (getForceVerbose) {
           ParallelDescriptor::ReduceRealMax(f_max.dataPtr(), AMREX_SPACEDIM, IOProc);
           amrex::Print() << "        FMAX = ";
           for (int k = 0; k < AMREX_SPACEDIM; k++)
           {
              amrex::Print() << f_max[k] << "  ";
           }
           amrex::Print() << '\n';
        }
        Print()<<"estimated timestep: dt = "<<estdt<<std::endl;
    }

    return estdt;
}